

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_b2mc(double *b,double *mc,int m,double a)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  uVar2 = (ulong)(uint)m;
  dVar4 = b[uVar2];
  dVar3 = dVar4;
  for (; mc[uVar2] = dVar4, 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    lVar1 = uVar2 - 1;
    dVar4 = dVar3 * a + b[lVar1];
    dVar3 = b[lVar1];
  }
  return;
}

Assistant:

static void HTS_b2mc(const double *b, double *mc, int m, const double a)
{
   double d, o;

   d = mc[m] = b[m];
   for (m--; m >= 0; m--) {
      o = b[m] + a * d;
      d = b[m];
      mc[m] = o;
   }
}